

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_map.h
# Opt level: O2

OpType * __thiscall
mocker::
SmallMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>
::at(SmallMap<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>
     *this,basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *k)

{
  pointer ppVar1;
  __type _Var2;
  out_of_range *this_00;
  pointer __lhs;
  
  __lhs = (this->mp).
          super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
  ppVar1 = (this->mp).
           super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_mocker::ir::RelationInst::OpType>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  while( true ) {
    if (__lhs == ppVar1) {
      this_00 = (out_of_range *)__cxa_allocate_exception(0x10);
      std::out_of_range::out_of_range(this_00,"Key does not exist.");
      __cxa_throw(this_00,&std::out_of_range::typeinfo,std::out_of_range::~out_of_range);
    }
    _Var2 = std::operator==(&__lhs->first,k);
    if (_Var2) break;
    __lhs = __lhs + 1;
  }
  return &__lhs->second;
}

Assistant:

const Val &at(const Key &k) const {
    for (const auto &kv : mp) {
      if (kv.first == k)
        return kv.second;
    }
    throw std::out_of_range("Key does not exist.");
  }